

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDarFrames(Abc_Ntk_t *pNtk,int nPrefix,int nFrames,int fInit,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  char *pcVar2;
  
  pAVar1 = (Abc_Ntk_t *)0x0;
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig != (Aig_Man_t *)0x0) {
    pMan = Saig_ManTimeframeSimplify(pAig,nPrefix,nFrames,fInit,fVerbose);
    Aig_ManStop(pAig);
    if (pMan == (Aig_Man_t *)0x0) {
      pAVar1 = (Abc_Ntk_t *)0x0;
    }
    else {
      pAVar1 = Abc_NtkFromAigPhase(pMan);
      pcVar2 = Extra_UtilStrsav(pNtk->pName);
      pAVar1->pName = pcVar2;
      pcVar2 = Extra_UtilStrsav(pNtk->pSpec);
      pAVar1->pSpec = pcVar2;
      Aig_ManStop(pMan);
    }
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarFrames( Abc_Ntk_t * pNtk, int nPrefix, int nFrames, int fInit, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    pMan = Saig_ManTimeframeSimplify( pTemp = pMan, nPrefix, nFrames, fInit, fVerbose );
    Aig_ManStop( pTemp );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkFromAigPhase( pMan );
    pNtkAig->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Aig_ManStop( pMan );
    return pNtkAig;
}